

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_hash.c
# Opt level: O0

FIOBJ fiobj_hash_pop(FIOBJ hash,FIOBJ *key)

{
  size_t sVar1;
  FIOBJ FVar2;
  fio_hash___couplet_s fVar3;
  FIOBJ local_48;
  FIOBJ local_30;
  FIOBJ old;
  FIOBJ *key_local;
  FIOBJ hash_local;
  
  if (hash != 0) {
    sVar1 = fiobj_type_is(hash,FIOBJ_T_HASH);
    if (sVar1 != 0) {
      sVar1 = fio_hash___count((fio_hash___s *)((hash & 0xfffffffffffffff8) + 8));
      if (sVar1 == 0) {
        fVar3 = fio_hash___last((fio_hash___s *)((hash & 0xfffffffffffffff8) + 8));
        local_30 = fVar3.obj;
        hash_local = fiobj_dup(local_30);
        if (key != (FIOBJ *)0x0) {
          fVar3 = fio_hash___last((fio_hash___s *)((hash & 0xfffffffffffffff8) + 8));
          local_48 = fVar3.key;
          FVar2 = fiobj_dup(local_48);
          *key = FVar2;
        }
        fio_hash___pop((fio_hash___s *)((hash & 0xfffffffffffffff8) + 8));
      }
      else {
        hash_local = 0;
      }
      return hash_local;
    }
  }
  __assert_fail("hash && FIOBJ_TYPE_IS(hash, FIOBJ_T_HASH)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fiobj/fiobj_hash.c"
                ,0xdb,"FIOBJ fiobj_hash_pop(FIOBJ, FIOBJ *)");
}

Assistant:

FIOBJ fiobj_hash_pop(FIOBJ hash, FIOBJ *key) {
  assert(hash && FIOBJ_TYPE_IS(hash, FIOBJ_T_HASH));
  FIOBJ old;
  if (fio_hash___count(&obj2hash(hash)->hash))
    return FIOBJ_INVALID;
  old = fiobj_dup(fio_hash___last(&obj2hash(hash)->hash).obj);
  if (key)
    *key = fiobj_dup(fio_hash___last(&obj2hash(hash)->hash).key);
  fio_hash___pop(&obj2hash(hash)->hash);
  return old;
}